

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::wdec14
               (unsigned_short l,unsigned_short h,unsigned_short *a,unsigned_short *b)

{
  unsigned_short uVar1;
  short bs;
  short as;
  int ai;
  int hi;
  short hs;
  short ls;
  unsigned_short *b_local;
  unsigned_short *a_local;
  unsigned_short h_local;
  unsigned_short l_local;
  
  uVar1 = l + (h & 1) + ((short)h >> 1);
  *a = uVar1;
  *b = uVar1 - h;
  return;
}

Assistant:

inline void
wdec14 (unsigned short  l, unsigned short  h,
        unsigned short &a, unsigned short &b)
{
    short ls = l;
    short hs = h;

    int hi = hs;
    int ai = ls + (hi & 1) + (hi >> 1);

    short as = ai;
    short bs = ai - hi;

    a = as;
    b = bs;
}